

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fifo_path_posix.cpp
# Opt level: O3

server_pipe __thiscall pstore::brokerface::fifo_path::open_server_pipe(fifo_path *this)

{
  char *path;
  int iVar1;
  value_type r;
  int iVar2;
  __mode_t __mask;
  int *piVar3;
  _Head_base<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
  extraout_RDX;
  pthread_mutex_t *in_RSI;
  server_pipe sVar4;
  int local_38 [2];
  int local_30 [2];
  
  path = *(char **)((long)in_RSI + 0x30);
  iVar2 = pthread_mutex_lock(in_RSI);
  if (iVar2 == 0) {
    anon_unknown.dwarf_17ea94::open_fifo((anon_unknown_dwarf_17ea94 *)local_30,path,0);
    if (local_30[0] < 0) {
      __mask = umask(0);
      iVar2 = mkfifo(path,0x11b6);
      umask(__mask);
      if (iVar2 != 0) {
        piVar3 = __errno_location();
LAB_00125df2:
        anon_unknown.dwarf_17ea94::raise_cannot_create_fifo(path,*piVar3);
      }
      LOCK();
      in_RSI[1].__size[0] = '\x01';
      UNLOCK();
      anon_unknown.dwarf_17ea94::open_fifo((anon_unknown_dwarf_17ea94 *)local_38,path,0);
      if (-1 < local_30[0]) {
        close(local_30[0]);
      }
      iVar2 = local_38[0];
      local_38[0] = -1;
      local_30[0] = iVar2;
      piVar3 = __errno_location();
      if (iVar2 < 0) goto LAB_00125df2;
    }
    anon_unknown.dwarf_17ea94::open_fifo((anon_unknown_dwarf_17ea94 *)local_38,path,1);
    iVar1 = local_30[0];
    iVar2 = local_38[0];
    if (-1 < local_38[0]) {
      local_38[0] = 0xffffffff;
      (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__lock = iVar2;
      local_30[0] = 0xffffffff;
      (this->open_server_pipe_mut_).super___mutex_base._M_mutex.__data.__owner = iVar1;
      pthread_mutex_unlock(in_RSI);
      sVar4.fd_.
      super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
      .
      super__Head_base<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
      ._M_head_impl = extraout_RDX._M_head_impl;
      sVar4.fd_.
      super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
      .
      super__Tuple_impl<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
      .
      super__Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
      ._M_head_impl =
           (_Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
            )(_Head_base<1UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_false>
              )this;
      return (server_pipe)
             sVar4.fd_.
             super__Tuple_impl<0UL,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>,_pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
      ;
    }
  }
  else {
    std::__throw_system_error(iVar2);
  }
  piVar3 = __errno_location();
  anon_unknown.dwarf_17ea94::raise_cannot_create_fifo(path,*piVar3);
}

Assistant:

auto fifo_path::open_server_pipe () -> server_pipe {
            auto * const path = path_.c_str ();
            std::lock_guard<decltype (open_server_pipe_mut_)> //! OCLINT
                const lock{open_server_pipe_mut_};

            // The server opens its well-known FIFO read-only (since it only reads from it) each
            // time the number of clients goes from 1 to 0, the server will read an end of file on
            // the FIFO. To prevent the server from having to handle this case, we use the trick of
            // just having the server open its well-known FIFO for read–write. Unfortunately,
            // POSIX.1 specifically states that opening a FIFO for read–write is undefined. Although
            // most UNIX systems allow this, we use two open() calls instead.

            pipe_descriptor fdread = open_fifo (path, O_RDONLY);
            if (fdread.native_handle () < 0) {
                // If the file open failed, we create the FIFO and try again.
                constexpr mode_t mode =
                    S_IFIFO | S_IRUSR | S_IWUSR | S_IRGRP | S_IWGRP | S_IROTH | S_IWOTH;
                if (make_fifo (path, mode) != 0) {
                    raise_cannot_create_fifo (path, errno);
                }

                needs_delete_ = true;

                fdread = open_fifo (path, O_RDONLY);
                if (fdread.native_handle () < 0) {
                    // Open failed for a second time. Give up.
                    raise_cannot_create_fifo (path, errno);
                }
            }

            pipe_descriptor fdwrite = open_fifo (path, O_WRONLY);
            if (fdwrite.native_handle () < 0) {
                raise_cannot_create_fifo (path, errno);
            }

            return {std::move (fdread), std::move (fdwrite)};
        }